

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

void anon_unknown.dwarf_1ece32d::mulnadd3
               (limb_t *c0,limb_t *c1,limb_t *c2,limb_t *d0,limb_t *d1,limb_t *d2,limb_t *n)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong *in_RCX;
  long *in_RDX;
  ulong *in_RSI;
  ulong uVar8;
  ulong *in_RDI;
  ulong *in_R8;
  long *in_R9;
  long in_FS_OFFSET;
  double_limb_t t;
  undefined8 local_48;
  undefined8 local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *in_RCX;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *t._8_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *in_RDI;
  auVar6 = auVar2 * auVar4 + auVar6;
  local_48 = auVar6._0_8_;
  *in_RDI = local_48;
  local_40 = auVar6._8_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *in_R8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *t._8_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *in_RSI;
  auVar7 = auVar3 * auVar5 + auVar7;
  uVar8 = auVar7._0_8_;
  *in_RSI = local_40 + uVar8;
  *in_RDX = auVar7._8_8_ + (ulong)CARRY8(local_40,uVar8) + *in_R9 * *t._8_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void mulnadd3(limb_t& c0, limb_t& c1, limb_t& c2, limb_t& d0, limb_t& d1, limb_t& d2, const limb_t& n)
{
    double_limb_t t = (double_limb_t)d0 * n + c0;
    c0 = t;
    t >>= LIMB_SIZE;
    t += (double_limb_t)d1 * n + c1;
    c1 = t;
    t >>= LIMB_SIZE;
    c2 = t + d2 * n;
}